

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_internal.c
# Opt level: O0

int mbedtls_rsa_deduce_primes
              (mbedtls_mpi *N,mbedtls_mpi *E,mbedtls_mpi *D,mbedtls_mpi *P,mbedtls_mpi *Q)

{
  int iVar1;
  size_t sVar2;
  size_t num_primes;
  uchar primes [54];
  undefined1 local_78 [8];
  mbedtls_mpi K;
  mbedtls_mpi T;
  ushort local_40;
  ushort local_3e;
  int iStack_3c;
  uint16_t order;
  uint16_t iter;
  uint16_t attempt;
  int ret;
  mbedtls_mpi *Q_local;
  mbedtls_mpi *P_local;
  mbedtls_mpi *D_local;
  mbedtls_mpi *E_local;
  mbedtls_mpi *N_local;
  
  memcpy(&num_primes,&DAT_001873d0,0x36);
  if ((((P == (mbedtls_mpi *)0x0) || (Q == (mbedtls_mpi *)0x0)) || (P->p != (mbedtls_mpi_uint *)0x0)
      ) || (Q->p != (mbedtls_mpi_uint *)0x0)) {
    N_local._4_4_ = -4;
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(N,0);
    if (((iVar1 < 1) || (iVar1 = mbedtls_mpi_cmp_int(D,1), iVar1 < 1)) ||
       ((iVar1 = mbedtls_mpi_cmp_mpi(D,N), -1 < iVar1 ||
        ((iVar1 = mbedtls_mpi_cmp_int(E,1), iVar1 < 1 ||
         (iVar1 = mbedtls_mpi_cmp_mpi(E,N), -1 < iVar1)))))) {
      N_local._4_4_ = -4;
    }
    else {
      mbedtls_mpi_init((mbedtls_mpi *)local_78);
      mbedtls_mpi_init((mbedtls_mpi *)&K.p);
      iStack_3c = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&K.p,D,E);
      if ((iStack_3c == 0) &&
         (iStack_3c = mbedtls_mpi_sub_int((mbedtls_mpi *)&K.p,(mbedtls_mpi *)&K.p,1), iStack_3c == 0
         )) {
        sVar2 = mbedtls_mpi_lsb((mbedtls_mpi *)&K.p);
        if ((sVar2 & 0xffff) == 0) {
          iStack_3c = -4;
        }
        else {
          iStack_3c = mbedtls_mpi_shift_r((mbedtls_mpi *)&K.p,sVar2 & 0xffff);
          if (iStack_3c == 0) {
            for (local_3e = (ushort)((*N->p & 7) == 1); local_3e < 0x36; local_3e = local_3e + 1) {
              mbedtls_mpi_lset((mbedtls_mpi *)local_78,(ulong)primes[(ulong)local_3e - 8]);
              iStack_3c = mbedtls_mpi_gcd(P,(mbedtls_mpi *)local_78,N);
              if (iStack_3c != 0) goto LAB_001476ed;
              iVar1 = mbedtls_mpi_cmp_int(P,1);
              if (iVar1 == 0) {
                iStack_3c = mbedtls_mpi_exp_mod((mbedtls_mpi *)local_78,(mbedtls_mpi *)local_78,
                                                (mbedtls_mpi *)&K.p,N,Q);
                if (iStack_3c != 0) goto LAB_001476ed;
                local_40 = 1;
                while ((local_40 <= (ushort)sVar2 &&
                       (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_78,1), iVar1 != 0))) {
                  iStack_3c = mbedtls_mpi_add_int((mbedtls_mpi *)local_78,(mbedtls_mpi *)local_78,1)
                  ;
                  if ((iStack_3c != 0) ||
                     (iStack_3c = mbedtls_mpi_gcd(P,(mbedtls_mpi *)local_78,N), iStack_3c != 0))
                  goto LAB_001476ed;
                  iVar1 = mbedtls_mpi_cmp_int(P,1);
                  if ((iVar1 == 1) && (iVar1 = mbedtls_mpi_cmp_mpi(P,N), iVar1 == -1)) {
                    iStack_3c = mbedtls_mpi_div_mpi(Q,(mbedtls_mpi *)0x0,N,P);
                    goto LAB_001476ed;
                  }
                  iStack_3c = mbedtls_mpi_sub_int((mbedtls_mpi *)local_78,(mbedtls_mpi *)local_78,1)
                  ;
                  if (iStack_3c != 0) goto LAB_001476ed;
                  iStack_3c = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_78,(mbedtls_mpi *)local_78,
                                                  (mbedtls_mpi *)local_78);
                  if ((iStack_3c != 0) ||
                     (iStack_3c = mbedtls_mpi_mod_mpi((mbedtls_mpi *)local_78,
                                                      (mbedtls_mpi *)local_78,N), iStack_3c != 0))
                  goto LAB_001476ed;
                  local_40 = local_40 + 1;
                }
                iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_78,1);
                if (iVar1 != 0) break;
              }
            }
            iStack_3c = -4;
          }
        }
      }
LAB_001476ed:
      mbedtls_mpi_free((mbedtls_mpi *)local_78);
      mbedtls_mpi_free((mbedtls_mpi *)&K.p);
      N_local._4_4_ = iStack_3c;
    }
  }
  return N_local._4_4_;
}

Assistant:

int mbedtls_rsa_deduce_primes( mbedtls_mpi const *N,
                     mbedtls_mpi const *E, mbedtls_mpi const *D,
                     mbedtls_mpi *P, mbedtls_mpi *Q )
{
    int ret = 0;

    uint16_t attempt;  /* Number of current attempt  */
    uint16_t iter;     /* Number of squares computed in the current attempt */

    uint16_t order;    /* Order of 2 in DE - 1 */

    mbedtls_mpi T;  /* Holds largest odd divisor of DE - 1     */
    mbedtls_mpi K;  /* Temporary holding the current candidate */

    const unsigned char primes[] = { 2,
           3,    5,    7,   11,   13,   17,   19,   23,
          29,   31,   37,   41,   43,   47,   53,   59,
          61,   67,   71,   73,   79,   83,   89,   97,
         101,  103,  107,  109,  113,  127,  131,  137,
         139,  149,  151,  157,  163,  167,  173,  179,
         181,  191,  193,  197,  199,  211,  223,  227,
         229,  233,  239,  241,  251
    };

    const size_t num_primes = sizeof( primes ) / sizeof( *primes );

    if( P == NULL || Q == NULL || P->p != NULL || Q->p != NULL )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    if( mbedtls_mpi_cmp_int( N, 0 ) <= 0 ||
        mbedtls_mpi_cmp_int( D, 1 ) <= 0 ||
        mbedtls_mpi_cmp_mpi( D, N ) >= 0 ||
        mbedtls_mpi_cmp_int( E, 1 ) <= 0 ||
        mbedtls_mpi_cmp_mpi( E, N ) >= 0 )
    {
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );
    }

    /*
     * Initializations and temporary changes
     */

    mbedtls_mpi_init( &K );
    mbedtls_mpi_init( &T );

    /* T := DE - 1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, D,  E ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &T, &T, 1 ) );

    if( ( order = (uint16_t) mbedtls_mpi_lsb( &T ) ) == 0 )
    {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    /* After this operation, T holds the largest odd divisor of DE - 1. */
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &T, order ) );

    /*
     * Actual work
     */

    /* Skip trying 2 if N == 1 mod 8 */
    attempt = 0;
    if( N->p[0] % 8 == 1 )
        attempt = 1;

    for( ; attempt < num_primes; ++attempt )
    {
        mbedtls_mpi_lset( &K, primes[attempt] );

        /* Check if gcd(K,N) = 1 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( P, &K, N ) );
        if( mbedtls_mpi_cmp_int( P, 1 ) != 0 )
            continue;

        /* Go through K^T + 1, K^(2T) + 1, K^(4T) + 1, ...
         * and check whether they have nontrivial GCD with N. */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &K, &K, &T, N,
                             Q /* temporarily use Q for storing Montgomery
                                * multiplication helper values */ ) );

        for( iter = 1; iter <= order; ++iter )
        {
            /* If we reach 1 prematurely, there's no point
             * in continuing to square K */
            if( mbedtls_mpi_cmp_int( &K, 1 ) == 0 )
                break;

            MBEDTLS_MPI_CHK( mbedtls_mpi_add_int( &K, &K, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( P, &K, N ) );

            if( mbedtls_mpi_cmp_int( P, 1 ) ==  1 &&
                mbedtls_mpi_cmp_mpi( P, N ) == -1 )
            {
                /*
                 * Have found a nontrivial divisor P of N.
                 * Set Q := N / P.
                 */

                MBEDTLS_MPI_CHK( mbedtls_mpi_div_mpi( Q, NULL, N, P ) );
                goto cleanup;
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, &K, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &K, &K, &K ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &K, &K, N ) );
        }

        /*
         * If we get here, then either we prematurely aborted the loop because
         * we reached 1, or K holds primes[attempt]^(DE - 1) mod N, which must
         * be 1 if D,E,N were consistent.
         * Check if that's the case and abort if not, to avoid very long,
         * yet eventually failing, computations if N,D,E were not sane.
         */
        if( mbedtls_mpi_cmp_int( &K, 1 ) != 0 )
        {
            break;
        }
    }

    ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;

cleanup:

    mbedtls_mpi_free( &K );
    mbedtls_mpi_free( &T );
    return( ret );
}